

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_buffered_region.cc
# Opt level: O2

void __thiscall
S2ShapeIndexBufferedRegion::Init
          (S2ShapeIndexBufferedRegion *this,S2ShapeIndex *index,S1ChordAngle radius)

{
  S1ChordAngle SVar1;
  S1ChordAngle local_40;
  Options local_38;
  
  (this->radius_).length2_ = radius.length2_;
  local_40.length2_ = radius.length2_;
  SVar1 = S1ChordAngle::Successor(&local_40);
  (this->radius_successor_).length2_ = SVar1.length2_;
  local_38.max_distance_.super_S1ChordAngle.length2_ = (S1ChordAngle)0.0;
  local_38.max_error_.length2_._0_6_ = 0;
  local_38.max_error_.length2_._6_2_ = 0;
  local_38.max_results_ = 0;
  local_38.include_interiors_ = false;
  local_38.use_brute_force_ = false;
  local_38._22_2_ = 0;
  S2ClosestEdgeQueryBase<S2MinDistance>::Options::Options(&local_38);
  *(ulong *)((long)&(this->query_).options_.super_Options.max_error_.length2_ + 6) =
       CONCAT62(local_38._16_6_,local_38.max_error_.length2_._6_2_);
  (this->query_).options_.super_Options.max_distance_.super_S1ChordAngle.length2_ =
       (double)local_38.max_distance_.super_S1ChordAngle.length2_;
  (this->query_).options_.super_Options.max_error_.length2_ =
       (double)CONCAT26(local_38.max_error_.length2_._6_2_,local_38.max_error_.length2_._0_6_);
  (this->query_).base_.index_ = index;
  S2ClosestEdgeQueryBase<S2MinDistance>::ReInit(&(this->query_).base_);
  (this->query_).options_.super_Options.include_interiors_ = true;
  return;
}

Assistant:

void S2ShapeIndexBufferedRegion::Init(const S2ShapeIndex* index,
                                      S1ChordAngle radius) {
  radius_ = radius;
  radius_successor_ = radius.Successor();
  query_.Init(index);
  query_.mutable_options()->set_include_interiors(true);
}